

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O0

EStatusCode __thiscall
PDFUsedFont::WriteState(PDFUsedFont *this,ObjectsContext *inStateWriter,ObjectIDType inObjectID)

{
  DictionaryContext *pDVar1;
  IndirectObjectsReferenceRegistry *this_00;
  allocator<char> local_c1;
  string local_c0;
  ObjectIDType local_a0;
  ObjectIDType writtenFontObject;
  string local_90;
  allocator<char> local_59;
  string local_58;
  DictionaryContext *local_38;
  DictionaryContext *pdfUsedFontObject;
  ObjectIDType OStack_28;
  EStatusCode status;
  ObjectIDType inObjectID_local;
  ObjectsContext *inStateWriter_local;
  PDFUsedFont *this_local;
  
  OStack_28 = inObjectID;
  inObjectID_local = (ObjectIDType)inStateWriter;
  inStateWriter_local = (ObjectsContext *)this;
  pdfUsedFontObject._4_4_ = ObjectsContext::StartNewIndirectObject(inStateWriter,inObjectID);
  this_local._4_4_ = pdfUsedFontObject._4_4_;
  if (pdfUsedFontObject._4_4_ == eSuccess) {
    pDVar1 = ObjectsContext::StartDictionary((ObjectsContext *)inObjectID_local);
    local_38 = pDVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Type",&local_59);
    DictionaryContext::WriteKey(pDVar1,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    pDVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"PDFUsedFont",(allocator<char> *)((long)&writtenFontObject + 7));
    DictionaryContext::WriteNameValue(pDVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)((long)&writtenFontObject + 7));
    local_a0 = 0;
    if (this->mWrittenFont != (IWrittenFont *)0x0) {
      this_00 = ObjectsContext::GetInDirectObjectsRegistry((ObjectsContext *)inObjectID_local);
      local_a0 = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
      pDVar1 = local_38;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"mWrittenFont",&local_c1);
      DictionaryContext::WriteKey(pDVar1,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      DictionaryContext::WriteNewObjectReferenceValue(local_38,local_a0);
    }
    ObjectsContext::EndDictionary((ObjectsContext *)inObjectID_local,local_38);
    ObjectsContext::EndIndirectObject((ObjectsContext *)inObjectID_local);
    if (this->mWrittenFont != (IWrittenFont *)0x0) {
      (*this->mWrittenFont->_vptr_IWrittenFont[5])(this->mWrittenFont,inObjectID_local,local_a0);
    }
    this_local._4_4_ = pdfUsedFontObject._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode PDFUsedFont::WriteState(ObjectsContext* inStateWriter,ObjectIDType inObjectID)
{
	EStatusCode status = inStateWriter->StartNewIndirectObject(inObjectID);
	if(status != eSuccess)
		return status;
	DictionaryContext* pdfUsedFontObject = inStateWriter->StartDictionary();

	pdfUsedFontObject->WriteKey("Type");
	pdfUsedFontObject->WriteNameValue("PDFUsedFont");

	ObjectIDType writtenFontObject = 0;

	if(mWrittenFont)
	{
		writtenFontObject = inStateWriter->GetInDirectObjectsRegistry().AllocateNewObjectID();

		pdfUsedFontObject->WriteKey("mWrittenFont");
		pdfUsedFontObject->WriteNewObjectReferenceValue(writtenFontObject);
	}

	inStateWriter->EndDictionary(pdfUsedFontObject);
	inStateWriter->EndIndirectObject();

	if(mWrittenFont)
		mWrittenFont->WriteState(inStateWriter,writtenFontObject);

	return status;
}